

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

bool __thiscall DPlayerMenu::MenuEvent(DPlayerMenu *this,int mkey,bool fromcontroller)

{
  FListMenuDescriptor *pFVar1;
  FListMenuItem *li;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  undefined8 in_RAX;
  long lVar6;
  uint green;
  char *pcVar7;
  uint red;
  char *val;
  DPlayerMenu *this_00;
  FBoolCVar *this_01;
  int v;
  FName current;
  undefined1 local_28 [8];
  
  pFVar1 = (this->super_DListMenu).mDesc;
  lVar6 = (long)pFVar1->mSelectedItem;
  if (lVar6 < 0) {
LAB_0033a60e:
    bVar2 = DListMenu::MenuEvent(&this->super_DListMenu,mkey,fromcontroller);
    return bVar2;
  }
  li = (pFVar1->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[lVar6];
  local_28 = (undefined1  [8])in_RAX;
  iVar3 = (*li->_vptr_FListMenuItem[0xd])(li,mkey,(ulong)fromcontroller);
  if ((char)iVar3 == '\0') goto LAB_0033a60e;
  this_00 = (DPlayerMenu *)(local_28 + 4);
  (*li->_vptr_FListMenuItem[7])(this_00,li,0);
  switch(local_28._4_4_) {
  case 0x202:
    if (mkey == 10) {
      PlayerNameChanged(this_00,li);
    }
    break;
  case 0x203:
    iVar3 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar3 != '\0') {
      iVar3 = 0xff;
      if (local_28._0_4_ != 0) {
        iVar3 = local_28._0_4_ + -1;
      }
      FIntCVar::operator=(&team,iVar3);
    }
    break;
  case 0x204:
    ColorSetChanged(this,li);
    break;
  case 0x205:
    iVar3 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar3 == '\0') {
      return true;
    }
    uVar4 = userinfo_t::GetColor((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
    green = uVar4 >> 8 & 0xff;
    red = local_28._0_4_;
    goto LAB_0033a74c;
  case 0x206:
    iVar3 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar3 == '\0') {
      return true;
    }
    uVar4 = userinfo_t::GetColor((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
    red = uVar4 >> 0x10 & 0xff;
    green = local_28._0_4_;
LAB_0033a74c:
    local_28._0_4_ = uVar4 & 0xff;
LAB_0033a81c:
    SendNewColor(this,red,green,local_28._0_4_);
    break;
  case 0x207:
    iVar3 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar3 == '\0') {
      return true;
    }
    uVar5 = userinfo_t::GetColor((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
    red = uVar5 >> 0x10 & 0xff;
    green = uVar5 >> 8 & 0xff;
    goto LAB_0033a81c;
  case 0x208:
    SkinChanged(this,li);
    break;
  case 0x209:
    iVar3 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar3 != '\0') {
      pcVar7 = "other";
      if (local_28._0_4_ == 1) {
        pcVar7 = "female";
      }
      val = "male";
      if (local_28._0_4_ != 0) {
        val = pcVar7;
      }
      cvar_set("gender",val);
    }
    break;
  case 0x20a:
    AutoaimChanged(this_00,li);
    break;
  case 0x20b:
    iVar3 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar3 == '\0') {
      return true;
    }
    this_01 = &neverswitchonpickup;
    goto LAB_0033a6d8;
  default:
    if (local_28._4_4_ == 5) {
      ClassChanged(this,li);
      return true;
    }
    if (local_28._4_4_ != 0x22d) {
      return true;
    }
    iVar3 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_28);
    if ((char)iVar3 == '\0') {
      return true;
    }
    this_01 = &cl_run;
LAB_0033a6d8:
    FBoolCVar::operator=(this_01,local_28._0_4_ != 0);
  }
  return true;
}

Assistant:

bool DPlayerMenu::MenuEvent (int mkey, bool fromcontroller)
{
	int v;
	if (mDesc->mSelectedItem >= 0)
	{
		FListMenuItem *li = mDesc->mItems[mDesc->mSelectedItem];
		if (li->MenuEvent(mkey, fromcontroller))
		{
			FName current = li->GetAction(NULL);
			switch(current)
			{
				// item specific handling comes here

			case NAME_Playerbox:
				if (mkey == MKEY_Input)
				{
					PlayerNameChanged(li);
				}
				break;

			case NAME_Team:
				if (li->GetValue(0, &v))
				{
					team = v==0? TEAM_NONE : v-1;
				}
				break;

			case NAME_Color:
					ColorSetChanged(li);
					break;

			case NAME_Red:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (v, GPART(color), BPART(color));
				}
				break;

			case NAME_Green:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (RPART(color), v, BPART(color));
				}
				break;

			case NAME_Blue:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (RPART(color), GPART(color), v);
				}
				break;

			case NAME_Class:
				ClassChanged(li);
				break;

			case NAME_Skin:
				SkinChanged(li);
				break;

			case NAME_Gender:
				if (li->GetValue(0, &v))
				{
					cvar_set ("gender", v==0? "male" : v==1? "female" : "other");
				}
				break;

			case NAME_Autoaim:
				AutoaimChanged(li);
				break;

			case NAME_Switch:
				if (li->GetValue(0, &v))
				{
					neverswitchonpickup = !!v;
				}
				break;

			case NAME_AlwaysRun:
				if (li->GetValue(0, &v))
				{
					cl_run = !!v;
				}
				break;

			default:
				break;
			}
			return true;
		}
	}
	return Super::MenuEvent(mkey, fromcontroller);
}